

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O2

int ffmkys(fitsfile *fptr,char *keyname,char *value,char *comm,int *status)

{
  FITSfile *pFVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  char *comm_00;
  undefined8 uStack_1d0;
  char valstring [71];
  char nextcomm [73];
  char oldval [71];
  char oldcomm [73];
  char card [81];
  
  if (0 < *status) {
    return *status;
  }
  uStack_1d0 = 0x1cc9e8;
  iVar4 = ffgkey(fptr,keyname,oldval,oldcomm,status);
  if (iVar4 < 1) {
    uStack_1d0 = 0x1cca01;
    ffs2c(value,valstring,status);
    comm_00 = oldcomm;
    if ((comm != (char *)0x0) && (comm_00 = oldcomm, *comm != '&')) {
      comm_00 = comm;
    }
    uStack_1d0 = 0x1cca33;
    ffmkky(keyname,valstring,comm_00,card,status);
    uStack_1d0 = 0x1cca41;
    ffmkey(fptr,card,status);
    pFVar1 = fptr->Fptr;
    lVar2 = pFVar1->nextkey;
    lVar3 = pFVar1->headstart[pFVar1->curhdu];
    iVar4 = *status;
    if (iVar4 < 1) {
      uStack_1d0 = 0x1cca6e;
      ffpmrk();
      uStack_1d0 = 0x1cca84;
      ffc2s(oldval,valstring,status);
      if (*status != 0xcc) {
        do {
          uStack_1d0 = 0x1ccab8;
          sVar5 = strlen(valstring);
          do {
            if (((int)sVar5 == 0) || (valstring[(long)(int)sVar5 + -1] != '&')) goto LAB_001cc9ec;
            nextcomm[0] = '\0';
            uStack_1d0 = 0x1ccae4;
            ffgcnt(fptr,valstring,nextcomm,status);
            sVar5 = 0;
          } while (nextcomm[0] == '\0' && valstring[0] == '\0');
          uStack_1d0 = 0x1ccafd;
          ffdrec(fptr,(int)((lVar2 - lVar3) / 0x50) + 1,status);
        } while( true );
      }
      uStack_1d0 = 0x1cca91;
      ffcmrk();
      *status = 0;
      iVar4 = 0;
    }
  }
  else {
LAB_001cc9ec:
    iVar4 = *status;
  }
  return iVar4;
}

Assistant:

int ffmkys(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           const char *value,       /* I - keyword value      */
           const char *comm,        /* I - keyword comment    */
           int *status)             /* IO - error status      */
{
  /* NOTE: This routine does not support long continued strings */
  /*  It will correctly overwrite an existing long continued string, */
  /*  but it will not write a new long string.  */

    char oldval[FLEN_VALUE], valstring[FLEN_VALUE];
    char oldcomm[FLEN_COMMENT];
    char card[FLEN_CARD], nextcomm[FLEN_COMMENT];
    int len, keypos;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, oldval, oldcomm, status) > 0)
        return(*status);                               /* get old comment */

    ffs2c(value, valstring, status);   /* convert value to a string */

    if (!comm || comm[0] == '&')  /* preserve the current comment string */
        ffmkky(keyname, valstring, oldcomm, card, status);
    else
        ffmkky(keyname, valstring, comm, card, status);

    ffmkey(fptr, card, status); /* overwrite the previous keyword */

    keypos = (int) (((((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])) / 80) + 1);

    if (*status > 0)           
        return(*status);

    /* check if old string value was continued over multiple keywords */
    ffpmrk(); /* put mark on message stack; erase any messages after this */
    ffc2s(oldval, valstring, status); /* remove quotes and trailing spaces */

    if (*status == VALUE_UNDEFINED) {
       ffcmrk();  /* clear any spurious error messages, back to the mark */
       *status = 0;
    } else {
        
      len = strlen(valstring);

      while (len && valstring[len - 1] == '&')  /* ampersand is continuation char */
      {
        nextcomm[0]='\0';
        ffgcnt(fptr, valstring, nextcomm, status);
        if (*valstring || strlen(nextcomm))
        {
            ffdrec(fptr, keypos, status);  /* delete the continuation */
            len = strlen(valstring);
        }
        else   /* a null valstring indicates no continuation */
            len = 0;
      }
    }

    return(*status);
}